

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caseconvert.cpp
# Opt level: O1

string_t __thiscall
duckdb::CaseConvertOperator<true>::Operation<duckdb::string_t,duckdb::string_t>
          (CaseConvertOperator<true> *this,string_t input,Vector *result)

{
  undefined1 auVar1 [16];
  int32_t iVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  StringVector *this_00;
  StringVector *extraout_RDX;
  StringVector *len;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  Vector *vector;
  char *c;
  int sz;
  undefined1 local_58 [8];
  char *local_50;
  int local_48;
  int local_44;
  undefined8 local_40;
  long local_38;
  
  this_00 = input.value._8_8_;
  local_38 = input.value._0_8_;
  lVar6 = input.value._0_8_;
  if (((ulong)this & 0xffffffff) < 0xd) {
    lVar6 = (long)&local_40 + 4;
  }
  vector = (Vector *)0x0;
  uVar8 = (ulong)this & 0xffffffff;
  len = this_00;
  local_40 = this;
  if (uVar8 != 0) {
    uVar7 = 0;
    do {
      lVar4 = 1;
      lVar5 = 1;
      if (*(char *)(lVar6 + uVar7) < '\0') {
        auVar1._12_4_ = 0;
        auVar1._0_12_ = stack0xffffffffffffffac;
        _local_58 = (anon_union_16_2_67f50693_for_value)(auVar1 << 0x20);
        iVar2 = Utf8Proc::UTF8ToCodepoint((char *)(uVar7 + lVar6),(int *)local_58);
        iVar2 = Utf8Proc::CodepointToUpper(iVar2);
        iVar3 = Utf8Proc::CodepointLength(iVar2);
        lVar5 = (long)iVar3;
        lVar4 = (long)(int)local_58._0_4_;
        len = extraout_RDX;
      }
      vector = (Vector *)(&vector->vector_type + lVar5);
      uVar7 = uVar7 + lVar4;
    } while (uVar7 < uVar8);
  }
  _local_58 = (anon_struct_16_3_d7536bce_for_pointer)
              StringVector::EmptyString(this_00,vector,(idx_t)len);
  if (uVar8 != 0) {
    c = local_58._8_8_;
    if ((uint)local_58._0_4_ < 0xd) {
      c = local_58 + 4;
    }
    uVar7 = 0;
    do {
      if ((long)*(char *)(lVar6 + uVar7) < 0) {
        local_44 = 0;
        local_48 = 0;
        iVar2 = Utf8Proc::UTF8ToCodepoint((char *)(uVar7 + lVar6),&local_44);
        iVar2 = Utf8Proc::CodepointToUpper(iVar2);
        Utf8Proc::CodepointToUtf8(iVar2,&local_48,c);
        c = c + local_48;
        lVar4 = (long)local_44;
      }
      else {
        *c = (&StringUtil::ASCII_TO_UPPER_MAP)[*(char *)(lVar6 + uVar7)];
        c = c + 1;
        lVar4 = 1;
      }
      uVar7 = uVar7 + lVar4;
    } while (uVar7 < uVar8);
  }
  uVar8 = (ulong)(uint)local_58._0_4_;
  if (uVar8 < 0xd) {
    switchD_0105b559::default(local_58 + uVar8 + 4,0,0xc - uVar8);
  }
  else {
    local_58._4_4_ = *(undefined4 *)local_50;
  }
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)_local_58;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, Vector &result) {
		auto input_data = input.GetData();
		auto input_length = input.GetSize();
		return UnicodeCaseConvert<IS_UPPER>(result, input_data, input_length);
	}